

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool __thiscall BaseIndex::BlockUntilSyncedToCurrentChain(BaseIndex *this)

{
  string_view source_file;
  bool bVar1;
  CBlockIndex *pCVar2;
  CBlockIndex *pCVar3;
  pointer pCVar4;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  CBlockIndex *best_block_index;
  CBlockIndex *chain_tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  Level in_stack_000000e0;
  char (*in_stack_000000f0) [31];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar5;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  CChain *in_stack_ffffffffffffff48;
  atomic<const_CBlockIndex_*> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  CBlockIndex *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff78;
  LogFlags in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  byte local_39;
  ConstevalFormatString<2U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar6;
  
  pcVar6 = *(char **)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
             (RecursiveMutex *)0xf71e00);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff50);
  if (bVar1) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
    pCVar2 = CChain::Tip(in_stack_ffffffffffffff48);
    std::atomic<const_CBlockIndex_*>::load
              (in_stack_ffffffffffffff50,(memory_order)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    pCVar3 = CBlockIndex::GetAncestor(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (pCVar3 == pCVar2) {
      local_39 = 1;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (pCVar3 != pCVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (char *)in_stack_ffffffffffffff50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (char *)in_stack_ffffffffffffff50);
      GetName_abi_cxx11_((BaseIndex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
      ;
      uVar5 = 2;
      source_file._M_str = pcVar6;
      source_file._M_len = in_stack_fffffffffffffff0;
      LogPrintFormatInternal<char[31],std::__cxx11::string>
                (in_stack_00000000,source_file,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 in_stack_000000e0,in_stack_ffffffffffffffe8,in_stack_000000f0,in_stack_000000f8);
      pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::
               operator->((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                          CONCAT44(in_stack_ffffffffffffff3c,uVar5));
      (*pCVar4->_vptr_Chain[0x36])();
      std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
                ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,uVar5));
      ValidationSignals::SyncWithValidationInterfaceQueue
                ((ValidationSignals *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
      ;
      local_39 = 1;
    }
  }
  else {
    local_39 = 0;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar6) {
    __stack_chk_fail();
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool BaseIndex::BlockUntilSyncedToCurrentChain() const
{
    AssertLockNotHeld(cs_main);

    if (!m_synced) {
        return false;
    }

    {
        // Skip the queue-draining stuff if we know we're caught up with
        // m_chain.Tip().
        LOCK(cs_main);
        const CBlockIndex* chain_tip = m_chainstate->m_chain.Tip();
        const CBlockIndex* best_block_index = m_best_block_index.load();
        if (best_block_index->GetAncestor(chain_tip->nHeight) == chain_tip) {
            return true;
        }
    }

    LogPrintf("%s: %s is catching up on block notifications\n", __func__, GetName());
    m_chain->context()->validation_signals->SyncWithValidationInterfaceQueue();
    return true;
}